

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O0

void __thiscall
trun::ResultsReportJSON::PrintPasses
          (ResultsReportJSON *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  initializer_list<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *this_00;
  bool bVar1;
  kTestResult kVar2;
  int iVar3;
  reference psVar4;
  element_type *this_01;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  shared_ptr<trun::TestResult> local_130;
  undefined4 local_11c;
  undefined1 local_118 [8];
  shared_ptr<trun::TestResult> r;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *__range1;
  less<trun::kTestResult> local_e8;
  anon_enum_8 local_e7 [5];
  bool bNeedComma;
  anon_enum_8 local_d1;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator local_28;
  _Alloc_hider local_20;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *local_18;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *results_local;
  ResultsReportJSON *this_local;
  
  local_18 = results;
  results_local =
       (vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
        *)this;
  if (((this->bHadFailures & 1U) != 0) || ((this->bHadSummary & 1U) != 0)) {
    ResultsReportPinterBase::WriteNoIndent(&this->super_ResultsReportPinterBase,",\n");
  }
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Passes\":[");
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  if ((PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
       ::resultToName_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                                   ::resultToName_abi_cxx11_), iVar3 != 0)) {
    local_d0 = &local_c8;
    local_d1 = kTestResult_Pass;
    std::
    pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<trun::kTestResult,_const_char_(&)[5],_true>(local_d0,&local_d1,(char (*) [5])"Pass");
    local_d0 = &local_a0;
    local_e7[2] = 3;
    std::
    pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<trun::kTestResult,_const_char_(&)[8],_true>
              (local_d0,local_e7 + 2,(char (*) [8])"AllFail");
    local_d0 = &local_78;
    local_e7[1] = 2;
    std::
    pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<trun::kTestResult,_const_char_(&)[11],_true>
              (local_d0,local_e7 + 1,(char (*) [11])"ModuleFail");
    local_d0 = &local_50;
    local_e7[0] = kTestResult_TestFail;
    std::
    pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<trun::kTestResult,_const_char_(&)[9],_true>(local_d0,local_e7,(char (*) [9])"TestFail");
    local_28 = &local_c8;
    local_20._M_p = (pointer)0x4;
    std::
    allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&__range1 + 7));
    __l._M_len = (size_type)local_20._M_p;
    __l._M_array = local_28;
    std::
    map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
           ::resultToName_abi_cxx11_,__l,&local_e8,
          (allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&__range1 + 7));
    std::
    allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&__range1 + 7));
    local_148 = (pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_28;
    do {
      local_148 = local_148 + -1;
      std::
      pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_148);
    } while (local_148 != &local_c8);
    __cxa_atexit(std::
                 map<trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<trun::kTestResult>,_std::allocator<std::pair<const_trun::kTestResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                         ::resultToName_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&PrintPasses(std::vector<std::shared_ptr<trun::TestResult>,std::allocator<std::shared_ptr<trun::TestResult>>>const&)
                         ::resultToName_abi_cxx11_);
  }
  this_00 = local_18;
  __range1._6_1_ = 0;
  __end1 = std::
           vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           ::begin(local_18);
  r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
       ::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                           (&__end1,(__normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                                     *)&r.
                                        super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), ((bVar1 ^ 0xffU) & 1) != 0) {
    psVar4 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<trun::TestResult>::shared_ptr((shared_ptr<trun::TestResult> *)local_118,psVar4);
    this_01 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_118);
    kVar2 = TestResult::Result(this_01);
    if (kVar2 == kTestResult_Pass) {
      if ((__range1._6_1_ & 1) != 0) {
        ResultsReportPinterBase::WriteNoIndent(&this->super_ResultsReportPinterBase,",\n");
      }
      std::shared_ptr<trun::TestResult>::shared_ptr
                (&local_130,(shared_ptr<trun::TestResult> *)local_118);
      PrintTestResult(this,&local_130);
      std::shared_ptr<trun::TestResult>::~shared_ptr(&local_130);
      __range1._6_1_ = 1;
      local_11c = 0;
    }
    else {
      local_11c = 3;
    }
    std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_118);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
    ::operator++(&__end1);
  }
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"");
  ResultsReportPinterBase::Write(&this->super_ResultsReportPinterBase,"]");
  this->bHadSuccess = true;
  return;
}

Assistant:

void ResultsReportJSON::PrintPasses(const std::vector<TestResult::Ref> &results) {
    if (bHadFailures || bHadSummary) {
        WriteNoIndent(",\n");
        //fprintf(fout,",\n");
    }
    WriteLine(R"("Passes":[)");
    PushIndent();
    static std::map<kTestResult, std::string> resultToName={
            {kTestResult_Pass, "Pass"},
            {kTestResult_AllFail, "AllFail"},
            {kTestResult_ModuleFail,"ModuleFail"},
            {kTestResult_TestFail, "TestFail"},
    };
    bool bNeedComma = false;

    for (auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            continue;
        }
        if (bNeedComma) {
            WriteNoIndent(",\n");
        }
        PrintTestResult(r);
        bNeedComma = true;
    }
    PopIndent();
    WriteLine("");
    Write("]");

    bHadSuccess = true;
}